

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  byte *pbVar9;
  byte *pbVar10;
  int tok;
  int local_44;
  char **local_40;
  ENCODING *local_38;
  
  uVar7 = (long)end - (long)ptr;
  if ((long)uVar7 < 2) {
    return -1;
  }
  bVar2 = *ptr;
  if (bVar2 < 0xdc) {
    if (bVar2 - 0xd8 < 4) {
LAB_001802c8:
      if (uVar7 < 4) {
        return -2;
      }
      goto LAB_001802e0;
    }
    if (bVar2 != 0) goto LAB_00180342;
    bVar3 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
    if (bVar3 < 0x16) {
      if (bVar3 == 5) goto LAB_001802e0;
      if (bVar3 == 6) {
        if (uVar7 == 2) {
          return -2;
        }
        goto LAB_001802e0;
      }
      if (bVar3 != 7) goto LAB_001802e0;
      goto LAB_001802c8;
    }
    if ((bVar3 != 0x16) && (bVar3 != 0x18)) {
      if (bVar3 != 0x1d) goto LAB_001802e0;
      goto LAB_00180342;
    }
  }
  else {
    if ((bVar2 - 0xdc < 4) || ((bVar2 == 0xff && (0xfd < (byte)ptr[1])))) goto LAB_001802e0;
LAB_00180342:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar2] << 5))
         >> ((byte)ptr[1] & 0x1f) & 1) == 0) goto LAB_001802e0;
  }
  if ((long)(uVar7 - 2) < 2) {
    return -1;
  }
  lVar8 = 5;
  lVar5 = 0;
  while( true ) {
    bVar2 = ptr[lVar8 + -3];
    if (bVar2 < 0xdc) break;
    if (bVar2 == 0xff) {
      if (0xfd < (byte)ptr[lVar8 + -2]) {
switchD_001803d0_caseD_8:
        pcVar6 = ptr + (2 - lVar5);
LAB_00180450:
        *nextTokPtr = pcVar6;
        return 0;
      }
    }
    else if (bVar2 - 0xdc < 4) goto switchD_001803d0_caseD_8;
switchD_001803d0_caseD_1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)ptr[lVar8 + -2] >> 3 & 0x1c |
                         (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5)) >>
         ((byte)ptr[lVar8 + -2] & 0x1f) & 1) == 0) goto switchD_001803d0_caseD_5;
switchD_001803d0_caseD_16:
    lVar1 = uVar7 + lVar5;
    lVar5 = lVar5 + -2;
    lVar8 = lVar8 + 2;
    if (lVar1 + -4 < 2) {
      return -1;
    }
  }
  if (bVar2 != 0) {
    if (bVar2 - 0xd8 < 4) goto switchD_001803d0_caseD_7;
    goto switchD_001803d0_caseD_1d;
  }
  local_40 = nextTokPtr;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[lVar8 + -2])) {
  case 5:
    break;
  case 6:
    if (uVar7 + lVar5 == 4) {
      return -2;
    }
    break;
  case 7:
switchD_001803d0_caseD_7:
    if ((uVar7 + lVar5) - 2 < 4) {
      return -2;
    }
    break;
  default:
    goto switchD_001803d0_caseD_8;
  case 9:
  case 10:
  case 0x15:
    local_38 = enc;
    iVar4 = big2_checkPiTarget((ENCODING *)ptr,ptr + (2 - lVar5),(char *)&local_44,(int *)nextTokPtr
                              );
    if (iVar4 == 0) {
      *local_40 = ptr + (2 - lVar5);
      return 0;
    }
    uVar7 = (uVar7 + lVar5) - 4;
    if ((long)uVar7 < 2) {
      return -1;
    }
    pbVar9 = (byte *)(ptr + (4 - lVar5));
    do {
      bVar2 = *pbVar9;
      if (0xdb < bVar2) {
        if (bVar2 == 0xff) {
          if (0xfd < pbVar9[1]) {
switchD_00180539_caseD_0:
            *local_40 = (char *)pbVar9;
            return 0;
          }
        }
        else if (bVar2 - 0xdc < 4) goto switchD_00180539_caseD_0;
        goto switchD_00180539_caseD_2;
      }
      if (bVar2 - 0xd8 < 4) {
switchD_00180539_caseD_7:
        if (uVar7 < 4) {
          return -2;
        }
        pbVar10 = pbVar9 + 4;
        goto LAB_00180561;
      }
      if (bVar2 == 0) {
        switch(*(undefined1 *)((long)local_38[1].scanners + (ulong)pbVar9[1])) {
        case 0:
        case 1:
        case 8:
          goto switchD_00180539_caseD_0;
        default:
          goto switchD_00180539_caseD_2;
        case 6:
          if (uVar7 == 2) {
            return -2;
          }
          pbVar10 = pbVar9 + 3;
          break;
        case 7:
          goto switchD_00180539_caseD_7;
        case 0xf:
          pbVar10 = pbVar9 + 2;
          if ((long)end - (long)pbVar10 < 2) {
            return -1;
          }
          if ((*pbVar10 == 0) && (pbVar9[3] == 0x3e)) {
            *local_40 = (char *)(pbVar9 + 4);
            return local_44;
          }
        }
      }
      else {
switchD_00180539_caseD_2:
        pbVar10 = pbVar9 + 2;
      }
LAB_00180561:
      uVar7 = (long)end - (long)pbVar10;
      pbVar9 = pbVar10;
      if ((long)uVar7 < 2) {
        return -1;
      }
    } while( true );
  case 0xf:
    local_38 = (ENCODING *)(ptr + (2 - lVar5));
    iVar4 = big2_checkPiTarget((ENCODING *)ptr,(char *)local_38,(char *)&local_44,(int *)nextTokPtr)
    ;
    if (iVar4 == 0) {
      *local_40 = (char *)local_38;
      return 0;
    }
    if ((long)(uVar7 + lVar5 + -4) < 2) {
      return -1;
    }
    pcVar6 = ptr + (4 - lVar5);
    nextTokPtr = local_40;
    if ((ptr[lVar8 + -1] == '\0') && (ptr[lVar8] == '>')) {
      *local_40 = ptr + (6 - lVar5);
      return local_44;
    }
    goto LAB_00180450;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_001803d0_caseD_16;
  case 0x1d:
    goto switchD_001803d0_caseD_1d;
  }
switchD_001803d0_caseD_5:
  ptr = ptr + (2 - lVar5);
LAB_001802e0:
  *nextTokPtr = ptr;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
               const char **nextTokPtr) {
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S:
    case BT_CR:
    case BT_LF:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}